

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O2

bool __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::new_block_index(ImplicitProducer *this)

{
  BlockIndexEntry *pBVar1;
  __pointer_type pBVar2;
  size_t sVar3;
  __int_type_conflict _Var4;
  BlockIndexEntry **ppBVar5;
  __pointer_type pBVar6;
  ulong uVar7;
  size_t sVar8;
  BlockIndexEntry *pBVar9;
  BlockIndexEntry *pBVar10;
  size_t sVar11;
  __int_type_conflict _Var12;
  size_t sVar13;
  size_t sVar14;
  
  pBVar2 = (this->blockIndex)._M_b._M_p;
  if (pBVar2 == (__pointer_type)0x0) {
    sVar14 = 0;
  }
  else {
    sVar14 = pBVar2->capacity;
  }
  sVar3 = this->nextBlockIndexCapacity;
  sVar13 = sVar14;
  if (pBVar2 == (__pointer_type)0x0) {
    sVar13 = sVar3;
  }
  pBVar6 = (__pointer_type)malloc(sVar3 * 8 + 0x36 + sVar13 * 0x10);
  if (pBVar6 != (__pointer_type)0x0) {
    uVar7 = (ulong)(-((int)pBVar6 + 0x28) & 7);
    pBVar10 = (BlockIndexEntry *)((long)&pBVar6[1].capacity + uVar7);
    pBVar1 = pBVar10 + sVar13;
    if (pBVar2 != (__pointer_type)0x0) {
      _Var4 = (pBVar2->tail).super___atomic_base<unsigned_long>._M_i;
      sVar8 = pBVar2->capacity;
      ppBVar5 = pBVar2->index;
      sVar11 = 0;
      _Var12 = _Var4;
      do {
        _Var12 = _Var12 + 1 & sVar8 - 1;
        (&pBVar1->key)[sVar11].super___atomic_base<unsigned_long>._M_i =
             (__int_type_conflict)ppBVar5[_Var12];
        sVar11 = sVar11 + 1;
      } while (_Var12 != _Var4);
      if (sVar14 != sVar11) {
        __assert_fail("i == prevCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                      ,0xb46,
                      "bool moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::new_block_index() [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                     );
      }
    }
    pBVar9 = pBVar10;
    for (sVar8 = 0; sVar13 != sVar8; sVar8 = sVar8 + 1) {
      (pBVar9->key).super___atomic_base<unsigned_long>._M_i = 1;
      *(BlockIndexEntry **)
       ((long)&pBVar6[1].capacity + sVar8 * 8 + sVar14 * 8 + sVar13 * 0x10 + uVar7) = pBVar9;
      pBVar9 = pBVar9 + 1;
    }
    pBVar6->prev = pBVar2;
    pBVar6->entries = pBVar10;
    pBVar6->index =
         (BlockIndexEntry **)
         ((long)&(pBVar1->key).super___atomic_base<unsigned_long>._M_i + (ulong)(-(int)pBVar1 & 7));
    pBVar6->capacity = sVar3;
    (pBVar6->tail).super___atomic_base<unsigned_long>._M_i = sVar3 - 1 & sVar14 - 1;
    (this->blockIndex)._M_b._M_p = pBVar6;
    this->nextBlockIndexCapacity = sVar3 * 2;
  }
  return pBVar6 != (__pointer_type)0x0;
}

Assistant:

bool new_block_index()
		{
			auto prev = blockIndex.load(std::memory_order_relaxed);
			size_t prevCapacity = prev == nullptr ? 0 : prev->capacity;
			auto entryCount = prev == nullptr ? nextBlockIndexCapacity : prevCapacity;
			auto raw = static_cast<char*>((Traits::malloc)(
				sizeof(BlockIndexHeader) +
				std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * entryCount +
				std::alignment_of<BlockIndexEntry*>::value - 1 + sizeof(BlockIndexEntry*) * nextBlockIndexCapacity));
			if (raw == nullptr) {
				return false;
			}
			
			auto header = new (raw) BlockIndexHeader;
			auto entries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(raw + sizeof(BlockIndexHeader)));
			auto index = reinterpret_cast<BlockIndexEntry**>(details::align_for<BlockIndexEntry*>(reinterpret_cast<char*>(entries) + sizeof(BlockIndexEntry) * entryCount));
			if (prev != nullptr) {
				auto prevTail = prev->tail.load(std::memory_order_relaxed);
				auto prevPos = prevTail;
				size_t i = 0;
				do {
					prevPos = (prevPos + 1) & (prev->capacity - 1);
					index[i++] = prev->index[prevPos];
				} while (prevPos != prevTail);
				assert(i == prevCapacity);
			}
			for (size_t i = 0; i != entryCount; ++i) {
				new (entries + i) BlockIndexEntry;
				entries[i].key.store(INVALID_BLOCK_BASE, std::memory_order_relaxed);
				index[prevCapacity + i] = entries + i;
			}
			header->prev = prev;
			header->entries = entries;
			header->index = index;
			header->capacity = nextBlockIndexCapacity;
			header->tail.store((prevCapacity - 1) & (nextBlockIndexCapacity - 1), std::memory_order_relaxed);
			
			blockIndex.store(header, std::memory_order_release);
			
			nextBlockIndexCapacity <<= 1;
			
			return true;
		}